

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mutexes.c
# Opt level: O2

void thread_rwlock_trylock_peer(void *unused)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  
  uv_mutex_lock(&mutex);
  eval_a = -0x10;
  iVar1 = uv_rwlock_tryrdlock(&rwlock);
  eval_b = (int64_t)iVar1;
  if (eval_b == -0x10) {
    eval_a = -0x10;
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    eval_b = (int64_t)iVar1;
    if (eval_b == -0x10) {
      synchronize();
      iVar1 = uv_rwlock_tryrdlock(&rwlock);
      eval_a = (int64_t)iVar1;
      eval_b = 0;
      if (eval_a == 0) {
        uv_rwlock_rdunlock(&rwlock);
        eval_a = -0x10;
        iVar1 = uv_rwlock_trywrlock(&rwlock);
        eval_b = (int64_t)iVar1;
        if (eval_b == -0x10) {
          synchronize();
          iVar1 = uv_rwlock_trywrlock(&rwlock);
          eval_a = (int64_t)iVar1;
          eval_b = 0;
          if (eval_a == 0) {
            synchronize();
            uv_rwlock_wrunlock(&rwlock);
            iVar1 = uv_rwlock_tryrdlock(&rwlock);
            eval_a = (int64_t)iVar1;
            eval_b = 0;
            if (eval_a == 0) {
              synchronize();
              uv_rwlock_rdunlock(&rwlock);
              synchronize_nowait();
              uv_mutex_unlock(&mutex);
              return;
            }
            pcVar4 = "0";
            pcVar3 = "uv_rwlock_tryrdlock(&rwlock)";
            uVar2 = 0x82;
          }
          else {
            pcVar4 = "0";
            pcVar3 = "uv_rwlock_trywrlock(&rwlock)";
            uVar2 = 0x7d;
          }
        }
        else {
          pcVar4 = "uv_rwlock_trywrlock(&rwlock)";
          pcVar3 = "UV_EBUSY";
          uVar2 = 0x79;
        }
      }
      else {
        pcVar4 = "0";
        pcVar3 = "uv_rwlock_tryrdlock(&rwlock)";
        uVar2 = 0x77;
      }
    }
    else {
      pcVar4 = "uv_rwlock_trywrlock(&rwlock)";
      pcVar3 = "UV_EBUSY";
      uVar2 = 0x73;
    }
  }
  else {
    pcVar4 = "uv_rwlock_tryrdlock(&rwlock)";
    pcVar3 = "UV_EBUSY";
    uVar2 = 0x72;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-mutexes.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

static void thread_rwlock_trylock_peer(void* unused) {
  (void) &unused;

  uv_mutex_lock(&mutex);

  /* Write lock held by other thread. */
  ASSERT_EQ(UV_EBUSY, uv_rwlock_tryrdlock(&rwlock));
  ASSERT_EQ(UV_EBUSY, uv_rwlock_trywrlock(&rwlock));
  synchronize();

  /* Read lock held by other thread. */
  ASSERT_OK(uv_rwlock_tryrdlock(&rwlock));
  uv_rwlock_rdunlock(&rwlock);
  ASSERT_EQ(UV_EBUSY, uv_rwlock_trywrlock(&rwlock));
  synchronize();

  /* Acquire write lock. */
  ASSERT_OK(uv_rwlock_trywrlock(&rwlock));
  synchronize();

  /* Release write lock and acquire read lock. */
  uv_rwlock_wrunlock(&rwlock);
  ASSERT_OK(uv_rwlock_tryrdlock(&rwlock));
  synchronize();

  uv_rwlock_rdunlock(&rwlock);
  synchronize_nowait();  /* Signal main thread we're going away. */
  uv_mutex_unlock(&mutex);
}